

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST1Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 local_40;
  uint align;
  uint type;
  uint load;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,8,4);
  uVar2 = fieldFromInstruction_4(Insn,4,2);
  if ((uVar1 == 6) && ((uVar2 & 2) != 0)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else if ((uVar1 == 7) && ((uVar2 & 2) != 0)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else if ((uVar1 == 10) && (uVar2 == 3)) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(Insn,0x15,1);
    if (uVar1 == 0) {
      local_40 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
    }
    else {
      local_40 = DecodeVLDInstruction(Inst,Insn,Address,Decoder);
    }
    Inst_local._4_4_ = local_40;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLDST1Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned load;
	unsigned type = fieldFromInstruction_4(Insn, 8, 4);
	unsigned align = fieldFromInstruction_4(Insn, 4, 2);
	if (type == 6 && (align & 2)) return MCDisassembler_Fail;
	if (type == 7 && (align & 2)) return MCDisassembler_Fail;
	if (type == 10 && align == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}